

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::List(ConfigData *config)

{
  TestCaseFilters *pTVar1;
  bool bVar2;
  int iVar3;
  What WVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  undefined4 extraout_var_01;
  long *plVar9;
  undefined4 extraout_var_02;
  domain_error *this;
  TestCaseFilters *this_00;
  char *pcVar10;
  size_type *psVar11;
  TestCaseInfo *testCase;
  ostringstream oss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  TestCaseInfo *local_1b0;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [22];
  
  WVar4 = config->listSpec;
  if ((WVar4 & Reports) != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Available reports:\n",0x13);
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var,iVar3));
    p_Var8 = *(_Rb_tree_node_base **)(lVar6 + 0x18);
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    for (; p_Var8 != (_Rb_tree_node_base *)(lVar6 + 8);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\t\t\'",4);
      (**(code **)(**(long **)(p_Var8 + 2) + 0x18))(local_1a8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_1a8,(long)local_1a0._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,local_198 + 1);
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    WVar4 = config->listSpec;
  }
  if ((WVar4 & Tests) != None) {
    if ((config->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (config->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar10 = "All available test cases:\n";
      lVar6 = 0x1a;
    }
    else {
      pcVar10 = "Matching test cases:\n";
      lVar6 = 0x15;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar6);
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
    plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
                               ((long *)CONCAT44(extraout_var_01,iVar3));
    testCase = (TestCaseInfo *)*plVar9;
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    local_1b0 = *(TestCaseInfo **)(lVar6 + 8);
    psVar11 = (size_type *)0x0;
    if (testCase != local_1b0) {
      do {
        pTVar1 = (config->filters).
                 super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (config->filters).
                       super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1;
            this_00 = this_00 + 1) {
          bVar2 = TestCaseFilters::shouldInclude(this_00,testCase);
          if (!bVar2) goto LAB_00135701;
        }
        psVar11 = (size_type *)((long)psVar11 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(testCase->m_name)._M_dataplus._M_p,
                            (testCase->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((~config->listSpec & 6) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t \'",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(testCase->m_description)._M_dataplus._M_p,
                              (testCase->m_description)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
        }
LAB_00135701:
        testCase = testCase + 1;
      } while (testCase != local_1b0);
    }
    local_1d0 = local_1c0;
    local_1a8 = (undefined1  [8])psVar11;
    if ((config->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (config->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"test case","");
      local_1a0._M_p = (pointer)local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_1d0,local_1c8 + (long)local_1d0);
      poVar7 = operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"matching test case","");
      local_1a0._M_p = (pointer)local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_1d0,local_1c8 + (long)local_1d0);
      poVar7 = operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != local_190) {
      operator_delete(local_1a0._M_p,local_190[0]._M_allocated_capacity + 1);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
  }
  if ((config->listSpec & All) != None) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Unknown list type",0x11);
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this,(string *)&local_1d0);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void List( const ConfigData& config ) {

        if( config.listSpec & List::Reports ) {
            std::cout << "Available reports:\n";
            IReporterRegistry::FactoryMap::const_iterator it = getRegistryHub().getReporterRegistry().getFactories().begin();
            IReporterRegistry::FactoryMap::const_iterator itEnd = getRegistryHub().getReporterRegistry().getFactories().end();
            for(; it != itEnd; ++it ) {
                // !TBD: consider listAs()
                std::cout << "\t" << it->first << "\n\t\t'" << it->second->getDescription() << "'\n";
            }
            std::cout << std::endl;
        }

        if( config.listSpec & List::Tests ) {
            if( config.filters.empty() )
                std::cout << "All available test cases:\n";
            else
                std::cout << "Matching test cases:\n";
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            std::size_t matchedTests = 0;
            for(; it != itEnd; ++it ) {
                if( matchesFilters( config.filters, *it ) ) {
                    matchedTests++;
                    // !TBD: consider listAs()
                    std::cout << "\t" << it->getName() << "\n";
                    if( ( config.listSpec & List::TestNames ) != List::TestNames )
                        std::cout << "\t\t '" << it->getDescription() << "'\n";
                }
            }
            if( config.filters.empty() )
                std::cout << pluralise( matchedTests, "test case" ) << std::endl;
            else
                std::cout << pluralise( matchedTests, "matching test case" ) << std::endl;
        }

        if( ( config.listSpec & List::All ) == 0 ) {
            std::ostringstream oss;
            oss << "Unknown list type";
            throw std::domain_error( oss.str() );
        }
    }